

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  bool bVar1;
  cmLinkImplementation *this_00;
  reference __x;
  reference item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar2;
  reference pvVar3;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string propagates;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1e0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1d8;
  const_iterator sit;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  const_iterator li_3;
  cmTargetSelectLinker tsl;
  string local_170;
  char *local_150;
  char *linkerLang;
  string local_140;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_120;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_118;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_110;
  const_iterator li_2;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_100;
  const_iterator li_1;
  cmTargetCollectLinkLanguages cll;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  const_iterator li;
  cmLinkImplementation *impl;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  LinkClosure *lc_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  languages._M_h._M_single_bucket = (__node_base_ptr)lc;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&impl);
  this_00 = GetLinkImplementation(this,config);
  if (this_00 == (cmLinkImplementation *)0x0) {
    __assert_fail("impl",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x74a,
                  "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
                 );
  }
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this_00->Languages);
  while( true ) {
    local_80._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this_00->Languages);
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_78);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&impl,__x);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_78);
  }
  cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
            ((cmTargetCollectLinkLanguages *)&li_1,this,config,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&impl,this);
  local_100._M_current =
       (cmLinkImplItem *)
       std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                 ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
  while( true ) {
    li_2.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur = (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               )std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                          ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                        *)&li_2);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
           ::operator*(&local_100);
    cmTargetCollectLinkLanguages::Visit
              ((cmTargetCollectLinkLanguages *)&li_1,&item->super_cmLinkItem);
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&local_100);
  }
  local_118._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&impl);
  std::__detail::
  _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              *)&local_110,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              *)&local_118);
  while( true ) {
    local_120._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&impl);
    bVar1 = std::__detail::operator!=(&local_110,&local_120);
    if (!bVar1) break;
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(languages._M_h._M_single_bucket + 4);
    pvVar3 = std::__detail::
             _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)&local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_01,pvVar3);
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)&local_110);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"HAS_CXX",(allocator *)((long)&linkerLang + 7));
  pcVar2 = GetProperty(this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkerLang + 7));
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,"LINKER_LANGUAGE",
               (allocator *)
               ((long)&tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    pcVar2 = GetProperty(this,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    local_150 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      cmTargetSelectLinker::cmTargetSelectLinker((cmTargetSelectLinker *)&li_3,this);
      local_1c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this_00->Languages);
      while( true ) {
        sit.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur = (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   )std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&this_00->Languages);
        bVar1 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&sit);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_1c8);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmTargetSelectLinker::Consider((cmTargetSelectLinker *)&li_3,pcVar2);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1c8);
      }
      local_1e0._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&impl);
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::_Node_const_iterator
                ((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)&local_1d8,
                 (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)&local_1e0);
      while( true ) {
        propagates.field_2._8_8_ =
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&impl);
        bVar1 = std::__detail::operator!=
                          (&local_1d8,
                           (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)((long)&propagates.field_2 + 8));
        if (!bVar1) break;
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                 ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                              *)&local_1d8);
        std::operator+(&local_228,"CMAKE_",pvVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_228,"_LINKER_PREFERENCE_PROPAGATES");
        std::__cxx11::string::~string((string *)&local_228);
        bVar1 = cmMakefile::IsOn(this->Makefile,(string *)local_208);
        if (bVar1) {
          std::__detail::
          _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          ::operator->((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        *)&local_1d8);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          cmTargetSelectLinker::Consider((cmTargetSelectLinker *)&li_3,pcVar2);
        }
        std::__cxx11::string::~string((string *)local_208);
        std::__detail::
        _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
        ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      *)&local_1d8);
      }
      cmTargetSelectLinker::Choose_abi_cxx11_(&local_248,(cmTargetSelectLinker *)&li_3);
      std::__cxx11::string::operator=
                ((string *)languages._M_h._M_single_bucket,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      cmTargetSelectLinker::~cmTargetSelectLinker((cmTargetSelectLinker *)&li_3);
    }
    else {
      std::__cxx11::string::operator=((string *)languages._M_h._M_single_bucket,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)languages._M_h._M_single_bucket,"CXX");
  }
  cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages((cmTargetCollectLinkLanguages *)&li_1)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&impl);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  CM_UNORDERED_SET<std::string> languages;
  cmLinkImplementation const* impl = this->GetLinkImplementation(config);
  assert(impl);
  for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
       li != impl->Languages.end(); ++li) {
    languages.insert(*li);
  }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for (std::vector<cmLinkImplItem>::const_iterator li =
         impl->Libraries.begin();
       li != impl->Libraries.end(); ++li) {
    cll.Visit(*li);
  }

  // Store the transitive closure of languages.
  for (CM_UNORDERED_SET<std::string>::const_iterator li = languages.begin();
       li != languages.end(); ++li) {
    lc.Languages.push_back(*li);
  }

  // Choose the language whose linker should be used.
  if (this->GetProperty("HAS_CXX")) {
    lc.LinkerLanguage = "CXX";
  } else if (const char* linkerLang = this->GetProperty("LINKER_LANGUAGE")) {
    lc.LinkerLanguage = linkerLang;
  } else {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
         li != impl->Languages.end(); ++li) {
      tsl.Consider(li->c_str());
    }

    // Now consider languages that propagate from linked targets.
    for (CM_UNORDERED_SET<std::string>::const_iterator sit = languages.begin();
         sit != languages.end(); ++sit) {
      std::string propagates =
        "CMAKE_" + *sit + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(sit->c_str());
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }
}